

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  ulong *puVar2;
  XSizeHints *hints;
  int height_local;
  int width_local;
  _GLFWwindow *window_local;
  
  puVar2 = (ulong *)XAllocSizeHints();
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      *puVar2 = *puVar2 | 0x30;
      *(int *)(puVar2 + 4) = width;
      *(int *)(puVar2 + 3) = width;
      *(int *)((long)puVar2 + 0x24) = height;
      *(int *)((long)puVar2 + 0x1c) = height;
    }
    else {
      if ((window->minwidth != -1) && (window->minheight != -1)) {
        *puVar2 = *puVar2 | 0x10;
        *(int *)(puVar2 + 3) = window->minwidth;
        *(int *)((long)puVar2 + 0x1c) = window->minheight;
      }
      if ((window->maxwidth != -1) && (window->maxheight != -1)) {
        *puVar2 = *puVar2 | 0x20;
        *(int *)(puVar2 + 4) = window->maxwidth;
        *(int *)((long)puVar2 + 0x24) = window->maxheight;
      }
      if ((window->numer != -1) && (window->denom != -1)) {
        *puVar2 = *puVar2 | 0x80;
        iVar1 = window->numer;
        *(int *)(puVar2 + 7) = iVar1;
        *(int *)(puVar2 + 6) = iVar1;
        iVar1 = window->denom;
        *(int *)((long)puVar2 + 0x3c) = iVar1;
        *(int *)((long)puVar2 + 0x34) = iVar1;
      }
    }
  }
  *puVar2 = *puVar2 | 0x200;
  *(undefined4 *)(puVar2 + 9) = 10;
  XSetWMNormalHints(_glfw.x11.display,(window->x11).handle,puVar2);
  XFree(puVar2);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}